

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_mipmaps_image *
rf_load_dds_image_to_buffer
          (rf_mipmaps_image *__return_storage_ptr__,void *src,rf_int src_size,void *dst,
          rf_int dst_size)

{
  undefined1 uVar1;
  ushort uVar2;
  _Bool _Var3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  rf_pixel_format rVar7;
  long *in_FS_OFFSET;
  uint local_140;
  uint local_13c;
  undefined4 uStack_10c;
  long lStack_e8;
  int dds_result_size_5;
  rf_int i_2;
  uchar blue;
  int dds_result_size_4;
  int dds_result_size_3;
  rf_int i_1;
  uchar alpha_1;
  long lStack_c0;
  int dds_result_size_2;
  rf_int i;
  uchar alpha;
  int dds_result_size_1;
  int dds_result_size;
  rf_dds_header header;
  rf_int dst_size_local;
  void *dst_local;
  rf_int src_size_local;
  void *src_local;
  
  header._120_8_ = dst_size;
  memset(__return_storage_ptr__,0,0x20);
  if ((((src != (void *)0x0) && (dst != (void *)0x0)) && (0 < (long)header._120_8_)) &&
     (0x7f < (ulong)src_size)) {
    memcpy(&dds_result_size_1,src,0x80);
    pvVar5 = (void *)((long)src + 0x80);
    lVar6 = src_size + -0x80;
    _Var3 = rf_match_str_cstr((char *)&dds_result_size_1,4,"DDS ");
    if (_Var3) {
      (__return_storage_ptr__->field_0).image.width = header.flags;
      (__return_storage_ptr__->field_0).image.height = header.size;
      if (header.pitch_or_linear_size == 0) {
        local_13c = 1;
      }
      else {
        local_13c = header.pitch_or_linear_size;
      }
      __return_storage_ptr__->mipmaps = local_13c;
      if (header.ddspf.flags == 0x10) {
        if (header.reserved_1[10] == 0x40) {
          iVar4 = header.flags * header.size * 2;
          if ((iVar4 <= lVar6) && ((long)iVar4 <= (long)header._120_8_)) {
            memcpy(dst,pvVar5,(long)iVar4);
            (__return_storage_ptr__->field_0).image.format = RF_UNCOMPRESSED_R5G6B5;
            (__return_storage_ptr__->field_0).image.data = dst;
            (__return_storage_ptr__->field_0).image.valid = true;
          }
        }
        else if (header.reserved_1[10] == 0x41) {
          if (header.ddspf.g_bit_mask == 0x8000) {
            iVar4 = header.flags * header.size * 2;
            if ((iVar4 <= lVar6) && ((long)iVar4 <= (long)header._120_8_)) {
              memcpy(dst,pvVar5,(long)iVar4);
              for (lStack_c0 = 0;
                  lStack_c0 <
                  (__return_storage_ptr__->field_0).image.width *
                  (__return_storage_ptr__->field_0).image.height; lStack_c0 = lStack_c0 + 1) {
                uVar2 = *(ushort *)
                         ((long)(__return_storage_ptr__->field_0).image.data + lStack_c0 * 2);
                *(short *)((long)(__return_storage_ptr__->field_0).image.data + lStack_c0 * 2) =
                     *(short *)((long)(__return_storage_ptr__->field_0).image.data + lStack_c0 * 2)
                     << 1;
                pvVar5 = (__return_storage_ptr__->field_0).image.data;
                *(ushort *)((long)pvVar5 + lStack_c0 * 2) =
                     *(short *)((long)pvVar5 + lStack_c0 * 2) +
                     (ushort)(byte)((int)(uint)uVar2 >> 0xf);
              }
              (__return_storage_ptr__->field_0).image.format = RF_UNCOMPRESSED_R5G5B5A1;
              (__return_storage_ptr__->field_0).image.data = dst;
              (__return_storage_ptr__->field_0).image.valid = true;
            }
          }
          else if (((header.ddspf.g_bit_mask == 0xf000) &&
                   (iVar4 = header.flags * header.size * 2, iVar4 <= lVar6)) &&
                  ((long)iVar4 <= (long)header._120_8_)) {
            memcpy(dst,pvVar5,(long)iVar4);
            for (_dds_result_size_4 = 0;
                _dds_result_size_4 <
                (__return_storage_ptr__->field_0).image.width *
                (__return_storage_ptr__->field_0).image.height;
                _dds_result_size_4 = _dds_result_size_4 + 1) {
              uVar2 = *(ushort *)
                       ((long)(__return_storage_ptr__->field_0).image.data + _dds_result_size_4 * 2)
              ;
              *(short *)((long)(__return_storage_ptr__->field_0).image.data + _dds_result_size_4 * 2
                        ) = *(short *)((long)(__return_storage_ptr__->field_0).image.data +
                                      _dds_result_size_4 * 2) << 4;
              pvVar5 = (__return_storage_ptr__->field_0).image.data;
              *(ushort *)((long)pvVar5 + _dds_result_size_4 * 2) =
                   *(short *)((long)pvVar5 + _dds_result_size_4 * 2) +
                   (ushort)(byte)((int)(uint)uVar2 >> 0xc);
            }
            (__return_storage_ptr__->field_0).image.format = RF_UNCOMPRESSED_R4G4B4A4;
            (__return_storage_ptr__->field_0).image.data = dst;
            (__return_storage_ptr__->field_0).image.valid = true;
          }
        }
      }
      else if ((header.reserved_1[10] == 0x40) && (header.ddspf.flags == 0x18)) {
        iVar4 = header.flags * header.size * 3;
        if ((iVar4 <= lVar6) && ((long)iVar4 <= (long)header._120_8_)) {
          memcpy(dst,pvVar5,(long)iVar4);
          (__return_storage_ptr__->field_0).image.format = RF_UNCOMPRESSED_R8G8B8;
          (__return_storage_ptr__->field_0).image.data = dst;
          (__return_storage_ptr__->field_0).image.valid = true;
        }
      }
      else if ((header.reserved_1[10] == 0x41) && (header.ddspf.flags == 0x20)) {
        iVar4 = header.flags * header.size * 4;
        if ((iVar4 <= lVar6) && ((long)iVar4 <= (long)header._120_8_)) {
          memcpy(dst,pvVar5,(long)iVar4);
          for (lStack_e8 = 0; lStack_e8 < (long)(ulong)(header.flags * header.size * 4);
              lStack_e8 = lStack_e8 + 4) {
            uVar1 = *(undefined1 *)((long)dst + lStack_e8);
            *(undefined1 *)((long)dst + lStack_e8) = *(undefined1 *)((long)dst + lStack_e8 + 2);
            *(undefined1 *)((long)dst + lStack_e8 + 2) = uVar1;
          }
          (__return_storage_ptr__->field_0).image.format = RF_UNCOMPRESSED_R8G8B8A8;
          (__return_storage_ptr__->field_0).image.data = dst;
          (__return_storage_ptr__->field_0).image.valid = true;
        }
      }
      else if (((header.reserved_1[10] == 4) || (header.reserved_1[10] == 5)) &&
              (header.ddspf.size != 0)) {
        if (header.pitch_or_linear_size < 2) {
          local_140 = header.height;
        }
        else {
          local_140 = header.height << 1;
        }
        if (((int)local_140 <= lVar6) && ((long)(int)local_140 <= (long)header._120_8_)) {
          memcpy(dst,pvVar5,(long)(int)local_140);
          if (header.ddspf.size == 0x31545844) {
            rVar7 = RF_COMPRESSED_DXT1_RGBA;
            if (header.reserved_1[10] == 4) {
              rVar7 = RF_COMPRESSED_DXT1_RGB;
            }
            (__return_storage_ptr__->field_0).image.format = rVar7;
          }
          else if (header.ddspf.size == 0x33545844) {
            (__return_storage_ptr__->field_0).image.format = RF_COMPRESSED_DXT3_RGBA;
          }
          else if (header.ddspf.size == 0x35545844) {
            (__return_storage_ptr__->field_0).image.format = RF_COMPRESSED_DXT5_RGBA;
          }
          (__return_storage_ptr__->field_0).image.data = dst;
          (__return_storage_ptr__->field_0).image.valid = true;
        }
      }
    }
    else {
      rf_log_impl(8,0x1b2e54,(char *)0x5);
      lVar6 = *in_FS_OFFSET;
      *(char **)(lVar6 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar6 + -0x458) = "rf_load_dds_image_to_buffer";
      *(undefined8 *)(lVar6 + -0x450) = 0x454c;
      *(ulong *)(lVar6 + -0x448) = CONCAT44(uStack_10c,5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mipmaps_image rf_load_dds_image_to_buffer(const void* src, rf_int src_size, void* dst, rf_int dst_size)
{
    rf_mipmaps_image result = { 0 };

    if (src && dst && dst_size > 0 && src_size >= sizeof(rf_dds_header))
    {
        rf_dds_header header = *(rf_dds_header*)src;

        src = ((char*)src) + sizeof(rf_dds_header);
        src_size -= sizeof(rf_dds_header);

        // Verify the type of file
        if (rf_match_str_cstr(header.id, sizeof(header.id), "DDS "))
        {
            result.width   = header.width;
            result.height  = header.height;
            result.mipmaps = (header.mipmap_count == 0) ? 1 : header.mipmap_count;

            if (header.ddspf.rgb_bit_count == 16) // 16bit mode, no compressed
            {
                if (header.ddspf.flags == 0x40) // no alpha channel
                {
                    int dds_result_size = header.width * header.height * sizeof(unsigned short);

                    if (src_size >= dds_result_size && dst_size >= dds_result_size)
                    {
                        memcpy(dst, src, dds_result_size);
                        result.format = RF_UNCOMPRESSED_R5G6B5;
                        result.data   = dst;
                        result.valid  = true;
                    }
                }
                else if (header.ddspf.flags == 0x41) // with alpha channel
                {
                    if (header.ddspf.a_bit_mask == 0x8000) // 1bit alpha
                    {
                        int dds_result_size = header.width * header.height * sizeof(unsigned short);

                        if (src_size >= dds_result_size && dst_size >= dds_result_size)
                        {
                            memcpy(dst, src, dds_result_size);

                            unsigned char alpha = 0;

                            // Data comes as A1R5G5B5, it must be reordered to R5G5B5A1
                            for (rf_int i = 0; i < result.width * result.height; i++)
                            {
                                alpha = ((unsigned short *)result.data)[i] >> 15;
                                ((unsigned short*)result.data)[i] = ((unsigned short *)result.data)[i] << 1;
                                ((unsigned short*)result.data)[i] += alpha;
                            }

                            result.format = RF_UNCOMPRESSED_R5G5B5A1;
                            result.data   = dst;
                            result.valid  = true;
                        }
                    }
                    else if (header.ddspf.a_bit_mask == 0xf000) // 4bit alpha
                    {
                        int dds_result_size = header.width * header.height * sizeof(unsigned short);

                        if (src_size >= dds_result_size && dst_size >= dds_result_size)
                        {
                            memcpy(dst, src, dds_result_size);

                            unsigned char alpha = 0;

                            // Data comes as A4R4G4B4, it must be reordered R4G4B4A4
                            for (rf_int i = 0; i < result.width * result.height; i++)
                            {
                                alpha = ((unsigned short*)result.data)[i] >> 12;
                                ((unsigned short*)result.data)[i] = ((unsigned short*)result.data)[i] << 4;
                                ((unsigned short*)result.data)[i] += alpha;
                            }

                            result.format = RF_UNCOMPRESSED_R4G4B4A4;
                            result.data   = dst;
                            result.valid  = true;
                        }
                    }
                }
            }
            else if (header.ddspf.flags == 0x40 && header.ddspf.rgb_bit_count == 24) // DDS_RGB, no compressed, not sure if this case exists...
            {
                int dds_result_size = header.width * header.height * 3;

                if (src_size >= dds_result_size && dst_size >= dds_result_size)
                {
                    memcpy(dst, src, dds_result_size);
                    result.format = RF_UNCOMPRESSED_R8G8B8;
                    result.data   = dst;
                    result.valid  = true;
                }
            }
            else if (header.ddspf.flags == 0x41 && header.ddspf.rgb_bit_count == 32) // DDS_RGBA, no compressed
            {
                int dds_result_size = header.width * header.height * 4;

                if (src_size >= dds_result_size && dst_size >= dds_result_size)
                {
                    memcpy(dst, src, dds_result_size);

                    unsigned char blue = 0;

                    // Data comes as A8R8G8B8, it must be reordered R8G8B8A8 (view next comment)
                    // DirecX understand ARGB as a 32bit DWORD but the actual memory byte alignment is BGRA
                    // So, we must realign B8G8R8A8 to R8G8B8A8
                    for (rf_int i = 0; i < header.width * header.height * 4; i += 4)
                    {
                        blue = ((unsigned char*)dst)[i];
                        ((unsigned char*)dst)[i + 0] = ((unsigned char*)dst)[i + 2];
                        ((unsigned char*)dst)[i + 2] = blue;
                    }

                    result.format = RF_UNCOMPRESSED_R8G8B8A8;
                    result.data   = dst;
                    result.valid  = true;
                }
            }
            else if (((header.ddspf.flags == 0x04) || (header.ddspf.flags == 0x05)) && (header.ddspf.four_cc > 0)) // Compressed
            {
                int dds_result_size = (header.mipmap_count > 1) ? (header.pitch_or_linear_size * 2) : header.pitch_or_linear_size;

                if (src_size >= dds_result_size && dst_size >= dds_result_size)
                {
                    memcpy(dst, src, dds_result_size);

                    switch (header.ddspf.four_cc)
                    {
                        case RF_FOURCC_DXT1: result.format = header.ddspf.flags == 0x04 ? RF_COMPRESSED_DXT1_RGB : RF_COMPRESSED_DXT1_RGBA; break;
                        case RF_FOURCC_DXT3: result.format = RF_COMPRESSED_DXT3_RGBA; break;
                        case RF_FOURCC_DXT5: result.format = RF_COMPRESSED_DXT5_RGBA; break;
                        default: break;
                    }

                    result.data  = dst;
                    result.valid = true;
                }
            }
        }
        else RF_LOG_ERROR(RF_BAD_FORMAT, "DDS file does not seem to be a valid result");
    }

    return result;
}